

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

bool __thiscall
nitro::options::parser::
try_parse_as_option<std::map<std::__cxx11::string,nitro::options::option*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,nitro::options::option*>>>,__gnu_cxx::__normal_iterator<nitro::options::user_input_const*,std::vector<nitro::options::user_input,std::allocator<nitro::options::user_input>>>>
          (parser *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nitro::options::option_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nitro::options::option_*>_>_>
          *options,__normal_iterator<const_nitro::options::user_input_*,_std::vector<nitro::options::user_input,_std::allocator<nitro::options::user_input>_>_>
                   *it,
          __normal_iterator<const_nitro::options::user_input_*,_std::vector<nitro::options::user_input,_std::allocator<nitro::options::user_input>_>_>
          end)

{
  option *poVar1;
  long *plVar2;
  bool bVar3;
  uint uVar4;
  reference puVar5;
  pointer puVar6;
  string *args_1;
  __normal_iterator<const_nitro::options::user_input_*,_std::vector<nitro::options::user_input,_std::allocator<nitro::options::user_input>_>_>
  local_58;
  __normal_iterator<const_nitro::options::user_input_*,_std::vector<nitro::options::user_input,_std::allocator<nitro::options::user_input>_>_>
  next;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nitro::options::option_*>
  *option;
  iterator __end0;
  iterator __begin0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nitro::options::option_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nitro::options::option_*>_>_>
  *__range2;
  __normal_iterator<const_nitro::options::user_input_*,_std::vector<nitro::options::user_input,_std::allocator<nitro::options::user_input>_>_>
  *it_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nitro::options::option_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nitro::options::option_*>_>_>
  *options_local;
  parser *this_local;
  __normal_iterator<const_nitro::options::user_input_*,_std::vector<nitro::options::user_input,_std::allocator<nitro::options::user_input>_>_>
  end_local;
  
  this_local = (parser *)end._M_current;
  __end0 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nitro::options::option_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nitro::options::option_*>_>_>
           ::begin(options);
  option = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nitro::options::option_*>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nitro::options::option_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nitro::options::option_*>_>_>
              ::end(options);
  while( true ) {
    bVar3 = std::operator!=(&__end0,(_Self *)&option);
    if (!bVar3) {
      return false;
    }
    next._M_current =
         (user_input *)
         std::
         _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nitro::options::option_*>_>
         ::operator*(&__end0);
    poVar1 = *(option **)&(next._M_current)->name_;
    puVar5 = __gnu_cxx::
             __normal_iterator<const_nitro::options::user_input_*,_std::vector<nitro::options::user_input,_std::allocator<nitro::options::user_input>_>_>
             ::operator*(it);
    uVar4 = (*(poVar1->super_crtp_base<nitro::options::option>).super_base._vptr_base[5])
                      (poVar1,puVar5);
    if ((uVar4 & 1) != 0) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nitro::options::option_*>_>
    ::operator++(&__end0);
  }
  puVar6 = __gnu_cxx::
           __normal_iterator<const_nitro::options::user_input_*,_std::vector<nitro::options::user_input,_std::allocator<nitro::options::user_input>_>_>
           ::operator->(it);
  bVar3 = user_input::has_value(puVar6);
  if (bVar3) {
    plVar2 = *(long **)&(next._M_current)->name_;
    puVar5 = __gnu_cxx::
             __normal_iterator<const_nitro::options::user_input_*,_std::vector<nitro::options::user_input,_std::allocator<nitro::options::user_input>_>_>
             ::operator*(it);
    (**(code **)(*plVar2 + 0x30))(plVar2,puVar5);
    return true;
  }
  local_58 = __gnu_cxx::
             __normal_iterator<const_nitro::options::user_input_*,_std::vector<nitro::options::user_input,_std::allocator<nitro::options::user_input>_>_>
             ::operator+(it,1);
  bVar3 = __gnu_cxx::operator!=
                    (&local_58,
                     (__normal_iterator<const_nitro::options::user_input_*,_std::vector<nitro::options::user_input,_std::allocator<nitro::options::user_input>_>_>
                      *)&this_local);
  if (bVar3) {
    puVar6 = __gnu_cxx::
             __normal_iterator<const_nitro::options::user_input_*,_std::vector<nitro::options::user_input,_std::allocator<nitro::options::user_input>_>_>
             ::operator->(&local_58);
    bVar3 = user_input::is_value(puVar6);
    if (bVar3) {
      plVar2 = *(long **)&(next._M_current)->name_;
      puVar5 = __gnu_cxx::
               __normal_iterator<const_nitro::options::user_input_*,_std::vector<nitro::options::user_input,_std::allocator<nitro::options::user_input>_>_>
               ::operator*(&local_58);
      (**(code **)(*plVar2 + 0x30))(plVar2,puVar5);
      __gnu_cxx::
      __normal_iterator<const_nitro::options::user_input_*,_std::vector<nitro::options::user_input,_std::allocator<nitro::options::user_input>_>_>
      ::operator++(it);
      return true;
    }
  }
  args_1 = options::base::name_abi_cxx11_(*(base **)&(next._M_current)->name_);
  except::raise<nitro::options::parsing_error,char_const(&)[36],std::__cxx11::string_const&>
            ((char (*) [36])"missing value for required option: ",args_1);
}

Assistant:

bool parser::try_parse_as_option(Options&& options, Iter& it, Iter end)
    {
        for (auto& option : options)
        {
            if (option.second->matches(*it))
            {
                if (it->has_value())
                {
                    option.second->update_value(*it);
                }
                else
                {
                    auto next = it + 1;

                    if (next != end && next->is_value())
                    {
                        option.second->update_value(*next);
                    }
                    else
                    {
                        raise<parsing_error>("missing value for required option: ",
                                             option.second->name());
                    }

                    ++it;
                }

                return true;
            }
        }

        return false;
    }